

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPSources::SenderTimeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPTime *pRVar1;
  HashElement *pHVar2;
  RTPInternalSourceData *pRVar3;
  HashElement **ppHVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  double dVar10;
  
  dVar10 = curtime->m_t - timeoutdelay->m_t;
  ppHVar4 = &(this->sourcelist).firsthashelem;
  iVar5 = this->sendercount;
  iVar6 = 0;
  iVar7 = 0;
  iVar8 = 0;
  while( true ) {
    pHVar2 = *ppHVar4;
    (this->sourcelist).curhashelem = pHVar2;
    if (pHVar2 == (HashElement *)0x0) break;
    pRVar3 = pHVar2->element;
    uVar9 = (pRVar3->super_RTPSourceData).receivedbye ^ 1;
    if ((pRVar3->super_RTPSourceData).validated == false) {
      uVar9 = 0;
    }
    if ((pRVar3->super_RTPSourceData).issender == true) {
      pRVar1 = &(pRVar3->super_RTPSourceData).stats.lastrtptime;
      if (dVar10 < pRVar1->m_t || dVar10 == pRVar1->m_t) {
        iVar6 = iVar6 + 1;
      }
      else {
        (pRVar3->super_RTPSourceData).issender = false;
        iVar5 = iVar5 + -1;
        this->sendercount = iVar5;
      }
    }
    iVar7 = iVar7 + uVar9;
    ppHVar4 = &pHVar2->listnext;
    iVar8 = iVar8 + 1;
  }
  this->totalcount = iVar8;
  this->sendercount = iVar6;
  this->activecount = iVar7;
  return;
}

Assistant:

void RTPSources::SenderTimeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();

		newtotalcount++;
		if (srcdat->IsActive())
			newactivecount++;

		if (srcdat->IsSender())
		{
			RTPTime lastrtppacktime = srcdat->INF_GetLastRTPPacketTime();

			if (lastrtppacktime < checktime) // timeout
			{
				srcdat->ClearSenderFlag();
				sendercount--;
			}
			else
				newsendercount++;
		}
		sourcelist.GotoNextElement();
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}